

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O2

void wenc16(uint16_t a,uint16_t b,uint16_t *l,uint16_t *h)

{
  int iVar1;
  undefined6 in_register_00000032;
  uint uVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  uVar2 = (uint)CONCAT62(in_register_0000003a,a) ^ 0x8000;
  iVar1 = (int)CONCAT62(in_register_00000032,b);
  iVar3 = uVar2 - iVar1;
  *l = (ushort)((uint)iVar3 >> 0x10) & 0x8000 ^ (ushort)(uVar2 + iVar1 >> 1);
  *h = (uint16_t)iVar3;
  return;
}

Assistant:

static inline void
wenc16 (uint16_t a, uint16_t b, uint16_t* l, uint16_t* h)
{
    int ao = (((int) a) + A_OFFSET) & MOD_MASK;
    int m  = ((ao + ((int) b)) >> 1);
    int d  = ao - ((int) b);

    if (d < 0) m = (m + M_OFFSET) & MOD_MASK;

    d &= MOD_MASK;

    *l = (uint16_t) m;
    *h = (uint16_t) d;
}